

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

void pybind11::cpp_function::destruct(function_record *rec,bool free_strings)

{
  function_record *pfVar1;
  pointer paVar2;
  PyObject *pPVar3;
  argument_record *arg;
  pointer paVar4;
  
  if (rec != (function_record *)0x0) {
    do {
      pfVar1 = rec->next;
      if (rec->free_data != (_func_void_function_record_ptr *)0x0) {
        (*rec->free_data)(rec);
      }
      if (free_strings) {
        free(rec->name);
        free(rec->doc);
        free(rec->signature);
        paVar2 = (rec->args).
                 super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (paVar4 = (rec->args).
                      super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                      ._M_impl.super__Vector_impl_data._M_start; paVar4 != paVar2;
            paVar4 = paVar4 + 1) {
          free(paVar4->name);
          free(paVar4->descr);
        }
      }
      paVar2 = (rec->args).
               super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (paVar4 = (rec->args).
                    super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                    ._M_impl.super__Vector_impl_data._M_start; paVar4 != paVar2; paVar4 = paVar4 + 1
          ) {
        pPVar3 = (paVar4->value).m_ptr;
        if ((pPVar3 != (PyObject *)0x0) &&
           (pPVar3->ob_refcnt = pPVar3->ob_refcnt + -1, pPVar3->ob_refcnt == 0)) {
          _Py_Dealloc();
        }
      }
      if (rec->def != (PyMethodDef *)0x0) {
        free(rec->def->ml_doc);
        if (rec->def != (PyMethodDef *)0x0) {
          operator_delete(rec->def,0x20);
        }
      }
      paVar4 = (rec->args).
               super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (paVar4 != (pointer)0x0) {
        operator_delete(paVar4,(long)(rec->args).
                                     super__Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)paVar4);
      }
      operator_delete(rec,0x88);
      rec = pfVar1;
    } while (pfVar1 != (function_record *)0x0);
  }
  return;
}

Assistant:

static void destruct(detail::function_record *rec, bool free_strings = true) {
        // If on Python 3.9, check the interpreter "MICRO" (patch) version.
        // If this is running on 3.9.0, we have to work around a bug.
        #if !defined(PYPY_VERSION) && PY_MAJOR_VERSION == 3 && PY_MINOR_VERSION == 9
            static bool is_zero = Py_GetVersion()[4] == '0';
        #endif

        while (rec) {
            detail::function_record *next = rec->next;
            if (rec->free_data)
                rec->free_data(rec);
            // During initialization, these strings might not have been copied yet,
            // so they cannot be freed. Once the function has been created, they can.
            // Check `make_function_record` for more details.
            if (free_strings) {
                std::free((char *) rec->name);
                std::free((char *) rec->doc);
                std::free((char *) rec->signature);
                for (auto &arg: rec->args) {
                    std::free(const_cast<char *>(arg.name));
                    std::free(const_cast<char *>(arg.descr));
                }
            }
            for (auto &arg: rec->args)
                arg.value.dec_ref();
            if (rec->def) {
                std::free(const_cast<char *>(rec->def->ml_doc));
                // Python 3.9.0 decref's these in the wrong order; rec->def
                // If loaded on 3.9.0, let these leak (use Python 3.9.1 at runtime to fix)
                // See https://github.com/python/cpython/pull/22670
                #if !defined(PYPY_VERSION) && PY_MAJOR_VERSION == 3 && PY_MINOR_VERSION == 9
                    if (!is_zero)
                        delete rec->def;
                #else
                    delete rec->def;
                #endif
            }
            delete rec;
            rec = next;
        }
    }